

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_enum_constant_list
          (t_cpp_generator *this,ostream *f,
          vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *constants,char *prefix,
          char *suffix,bool include_values)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  size_t sVar4;
  pointer pptVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(f," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (f,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar5 = (constants->super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (constants->super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar2 = true;
    do {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(f,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (f,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,f,*pptVar5);
      poVar3 = t_generator::indent((t_generator *)this,f);
      if (prefix == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(prefix);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,prefix,sVar4);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,((*pptVar5)->name_)._M_dataplus._M_p,
                          ((*pptVar5)->name_)._M_string_length);
      if (suffix == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(suffix);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,suffix,sVar4);
      }
      if (include_values) {
        std::__ostream_insert<char,std::char_traits<char>>(f," = ",3);
        std::ostream::operator<<(f,(*pptVar5)->value_);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             (constants->super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (f,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_enum_constant_list(std::ostream& f,
                                                  const vector<t_enum_value*>& constants,
                                                  const char* prefix,
                                                  const char* suffix,
                                                  bool include_values) {
  f << " {" << endl;
  indent_up();

  vector<t_enum_value*>::const_iterator c_iter;
  bool first = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    if (first) {
      first = false;
    } else {
      f << "," << endl;
    }
    generate_java_doc(f, *c_iter);
    indent(f) << prefix << (*c_iter)->get_name() << suffix;
    if (include_values) {
      f << " = " << (*c_iter)->get_value();
    }
  }

  f << endl;
  indent_down();
  indent(f) << "};" << endl;
}